

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O1

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg(nordic_itch_handler *this,itch_cross_trade *m)

{
  char *pcVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  undefined8 uVar4;
  _Hash_node_base *p_Var5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  char *end;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  trade t;
  event eStack_78;
  trade local_38;
  
  pcVar1 = m->OrderBook;
  lVar6 = 0;
  do {
    if (pcVar1[lVar6] != ' ') {
      pcVar7 = pcVar1 + lVar6;
      break;
    }
    lVar6 = lVar6 + 1;
    pcVar7 = m->CrossPrice;
  } while (lVar6 != 6);
  p_Var5 = (_Hash_node_base *)0x0;
  for (; pcVar7 != m->CrossPrice; pcVar7 = pcVar7 + 1) {
    p_Var5 = (_Hash_node_base *)(((long)*pcVar7 + (long)p_Var5 * 10) - 0x30);
  }
  uVar2 = (this->order_book_id_map)._M_h._M_bucket_count;
  uVar8 = (ulong)p_Var5 % uVar2;
  p_Var9 = (this->order_book_id_map)._M_h._M_buckets[uVar8];
  p_Var10 = (__node_base_ptr)0x0;
  if ((p_Var9 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var9->_M_nxt, p_Var10 = p_Var9, p_Var5 != p_Var9->_M_nxt[1]._M_nxt)) {
    while (p_Var9 = p_Var3, p_Var3 = p_Var9->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var10 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar2 != uVar8) ||
         (p_Var10 = p_Var9, p_Var5 == p_Var3[1]._M_nxt)) goto LAB_001184e2;
    }
    p_Var10 = (__node_base_ptr)0x0;
  }
LAB_001184e2:
  if (p_Var10 == (__node_base_ptr)0x0) {
    p_Var5 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var5 = p_Var10->_M_nxt;
  }
  if (p_Var5 != (_Hash_node_base *)0x0) {
    lVar6 = 0;
    do {
      if (m->CrossPrice[lVar6] != ' ') {
        pcVar7 = m->CrossPrice + lVar6;
        break;
      }
      lVar6 = lVar6 + 1;
      pcVar7 = m->MatchNumber;
    } while (lVar6 != 10);
    local_38.price = 0;
    for (; pcVar7 != m->MatchNumber; pcVar7 = pcVar7 + 1) {
      local_38.price = ((long)*pcVar7 + local_38.price * 10) - 0x30;
    }
    lVar6 = 1;
    do {
      if (m->Quantity[lVar6 + -1] != ' ') {
        pcVar7 = m->Quantity + lVar6 + -1;
        break;
      }
      lVar6 = lVar6 + 1;
      pcVar7 = pcVar1;
    } while (lVar6 != 10);
    local_38.size = 0;
    for (; pcVar7 != pcVar1; pcVar7 = pcVar7 + 1) {
      local_38.size = ((long)*pcVar7 + local_38.size * 10) - 0x30;
    }
    local_38.timestamp = this->time_sec * 1000 + this->time_msec;
    local_38.sign = crossing;
    make_trade_event(&eStack_78,(string *)(p_Var5 + 2),local_38.timestamp,&local_38,0);
    if ((this->_process_event).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar4 = std::__throw_bad_function_call();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)eStack_78._symbol._M_dataplus._M_p != &eStack_78._symbol.field_2) {
        operator_delete(eStack_78._symbol._M_dataplus._M_p,
                        eStack_78._symbol.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar4);
    }
    (*(this->_process_event)._M_invoker)((_Any_data *)&this->_process_event,&eStack_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)eStack_78._symbol._M_dataplus._M_p != &eStack_78._symbol.field_2) {
      operator_delete(eStack_78._symbol._M_dataplus._M_p,
                      eStack_78._symbol.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_cross_trade* m)
{
    auto order_book_id = itch_uatoi(m->OrderBook, sizeof(m->OrderBook));
    auto it = order_book_id_map.find(order_book_id);
    if (it != order_book_id_map.end()) {
        uint64_t cross_price = itch_uatoi(m->CrossPrice, sizeof(m->CrossPrice));
        uint64_t quantity = itch_uatoi(m->Quantity, sizeof(m->Quantity));
        auto& ob = it->second;
        trade t{timestamp(), cross_price, quantity, trade_sign::crossing};
        _process_event(make_trade_event(ob.symbol(), timestamp(), &t));
    }
}